

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O2

void dLineClosestApproach
               (cbtVector3 *pa,cbtVector3 *ua,cbtVector3 *pb,cbtVector3 *ub,cbtScalar *alpha,
               cbtScalar *beta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  cbtScalar cVar4;
  undefined1 extraout_var [12];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  cVar4 = dDOT(ua->m_floats,ub->m_floats);
  fVar6 = 0.0;
  auVar2._4_12_ = extraout_var;
  auVar2._0_4_ = cVar4;
  auVar1._4_12_ = extraout_var;
  auVar1._0_4_ = cVar4;
  auVar2 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar2,auVar1);
  fVar5 = 0.0;
  if (0.0001 < auVar2._0_4_) {
    fVar6 = pb->m_floats[1] - pa->m_floats[1];
    auVar8 = ZEXT416((uint)(pb->m_floats[0] - pa->m_floats[0]));
    auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * ub->m_floats[1])),auVar8,
                             ZEXT416((uint)ub->m_floats[0]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * ua->m_floats[1])),auVar8,
                             ZEXT416((uint)ua->m_floats[0]));
    auVar7 = ZEXT416((uint)(pb->m_floats[2] - pa->m_floats[2]));
    auVar1 = vfmadd231ss_fma(auVar1,auVar7,ZEXT416((uint)ub->m_floats[2]));
    auVar8 = vfmadd231ss_fma(auVar8,auVar7,ZEXT416((uint)ua->m_floats[2]));
    fVar5 = 1.0 / auVar2._0_4_;
    auVar7._4_12_ = extraout_var;
    auVar7._0_4_ = cVar4;
    auVar7 = vfnmadd213ss_fma(auVar1,auVar7,auVar8);
    auVar3._4_12_ = extraout_var;
    auVar3._0_4_ = cVar4;
    auVar2 = vfmsub213ss_fma(auVar8,auVar3,auVar1);
    fVar6 = fVar5 * auVar7._0_4_;
    fVar5 = fVar5 * auVar2._0_4_;
  }
  *alpha = fVar6;
  *beta = fVar5;
  return;
}

Assistant:

void dLineClosestApproach(const cbtVector3& pa, const cbtVector3& ua,
						  const cbtVector3& pb, const cbtVector3& ub,
						  cbtScalar* alpha, cbtScalar* beta)
{
	cbtVector3 p;
	p[0] = pb[0] - pa[0];
	p[1] = pb[1] - pa[1];
	p[2] = pb[2] - pa[2];
	cbtScalar uaub = dDOT(ua, ub);
	cbtScalar q1 = dDOT(ua, p);
	cbtScalar q2 = -dDOT(ub, p);
	cbtScalar d = 1 - uaub * uaub;
	if (d <= cbtScalar(0.0001f))
	{
		// @@@ this needs to be made more robust
		*alpha = 0;
		*beta = 0;
	}
	else
	{
		d = 1.f / d;
		*alpha = (q1 + uaub * q2) * d;
		*beta = (uaub * q1 + q2) * d;
	}
}